

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::GetTerminalAttribute
               (Stage *stage,Attribute *attr,string *attr_name,Attribute *value,string *err)

{
  bool bVar1;
  ostream *poVar2;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *__x;
  size_type sVar3;
  reference rhs;
  string *psVar4;
  value_type *ppPVar5;
  size_type sVar6;
  error_type *peVar7;
  undefined1 show_full_path;
  Attribute *pAVar8;
  string local_be0 [32];
  ostringstream local_bc0 [8];
  ostringstream ss_e_4;
  string local_a38 [32];
  string local_a18;
  allocator local_9f1;
  string local_9f0 [32];
  fmt local_9d0 [32];
  ostringstream local_9b0 [8];
  ostringstream ss_e_3;
  undefined1 local_838 [8];
  string abs_path;
  Prim *targetPrim;
  string local_808;
  Path local_7e8;
  undefined1 local_718 [8];
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  targetPrimRet;
  string targetPrimPropName;
  string targetPrimPath;
  value_type target;
  allocator local_5b9;
  string local_5b8;
  string local_598;
  ostringstream local_578 [8];
  ostringstream ss_e_2;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [32];
  fmt local_3b0 [32];
  ostringstream local_390 [8];
  ostringstream ss_e_1;
  undefined1 local_218 [8];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> pv;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  visited_paths;
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  string *err_local;
  Attribute *value_local;
  string *attr_name_local;
  Attribute *attr_local;
  Stage *stage_local;
  
  if (value == (Attribute *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar2 = ::std::operator<<((ostream *)local_1b0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"GetTerminalAttribute");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb22);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1b0,"`value` arg is nullptr.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=
                ((string *)err,
                 (string *)&visited_paths._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ::std::__cxx11::string::~string
                ((string *)&visited_paths._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    stage_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  else {
    pAVar8 = value;
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
    show_full_path = SUB81(pAVar8,0);
    bVar1 = Attribute::is_connection(attr);
    if (bVar1) {
      __x = Attribute::connections(attr);
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_218,__x);
      bVar1 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::empty
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_218);
      if (bVar1) {
        ::std::__cxx11::ostringstream::ostringstream(local_390);
        poVar2 = ::std::operator<<((ostream *)local_390,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"GetTerminalAttribute");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb2b);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_3d0,"Connection targetPath is empty for Attribute {}.",&local_3d1);
        fmt::format<std::__cxx11::string>
                  (local_3b0,(string *)local_3d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_name);
        poVar2 = ::std::operator<<((ostream *)local_390,(string *)local_3b0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_3b0);
        ::std::__cxx11::string::~string(local_3d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)err,local_3f8);
          ::std::__cxx11::string::~string(local_3f8);
        }
        stage_local._7_1_ = false;
        ::std::__cxx11::ostringstream::~ostringstream(local_390);
      }
      else {
        sVar3 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_218);
        if (sVar3 < 2) {
          rhs = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_218,0);
          Path::Path((Path *)((long)&targetPrimPath.field_2 + 8),rhs);
          psVar4 = Path::prim_part_abi_cxx11_((Path *)((long)&targetPrimPath.field_2 + 8));
          ::std::__cxx11::string::string
                    ((string *)(targetPrimPropName.field_2._M_local_buf + 8),(string *)psVar4);
          psVar4 = Path::prop_part_abi_cxx11_((Path *)((long)&targetPrimPath.field_2 + 8));
          ::std::__cxx11::string::string
                    ((string *)
                     &targetPrimRet.contained.
                      super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,(string *)psVar4);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_808,"",(allocator *)((long)&targetPrim + 7));
          Path::Path(&local_7e8,(string *)((long)&targetPrimPropName.field_2 + 8),&local_808);
          Stage::GetPrimAtPath_abi_cxx11_
                    ((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_718,stage,&local_7e8);
          Path::~Path(&local_7e8);
          ::std::__cxx11::string::~string((string *)&local_808);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&targetPrim + 7));
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_718);
          if (bVar1) {
            ppPVar5 = nonstd::expected_lite::
                      expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::value((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_718);
            abs_path.field_2._8_8_ = *ppPVar5;
            Path::full_path_name_abi_cxx11_
                      ((string *)local_838,(Path *)((long)&targetPrimPath.field_2 + 8));
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&pv.
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (key_type *)local_838);
            if (sVar6 == 0) {
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_838
                      );
              stage_local._7_1_ =
                   anon_unknown_6::GetTerminalAttributeImpl
                             (stage,(Prim *)abs_path.field_2._8_8_,
                              (string *)
                              &targetPrimRet.contained.
                               super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .m_has_value,value,err,
                              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&pv.
                                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_9b0);
              poVar2 = ::std::operator<<((ostream *)local_9b0,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"GetTerminalAttribute");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb46);
              ::std::operator<<(poVar2," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_9f0,"Circular referencing detected. connectionTargetPath = {}",
                         &local_9f1);
              tinyusdz::to_string_abi_cxx11_
                        (&local_a18,(tinyusdz *)(targetPrimPath.field_2._M_local_buf + 8),
                         (Path *)0x1,(bool)show_full_path);
              fmt::format<std::__cxx11::string>
                        (local_9d0,(string *)local_9f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_a18);
              poVar2 = ::std::operator<<((ostream *)local_9b0,(string *)local_9d0);
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::string::~string((string *)local_9d0);
              ::std::__cxx11::string::~string((string *)&local_a18);
              ::std::__cxx11::string::~string(local_9f0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
              if (err != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::__cxx11::string::operator+=((string *)err,local_a38);
                ::std::__cxx11::string::~string(local_a38);
              }
              stage_local._7_1_ = false;
              ::std::__cxx11::ostringstream::~ostringstream(local_9b0);
            }
            ::std::__cxx11::string::~string((string *)local_838);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_bc0);
            poVar2 = ::std::operator<<((ostream *)local_bc0,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"GetTerminalAttribute");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb4e);
            ::std::operator<<(poVar2," ");
            peVar7 = nonstd::expected_lite::
                     expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_718);
            poVar2 = ::std::operator<<((ostream *)local_bc0,(string *)peVar7);
            ::std::operator<<(poVar2,"\n");
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_be0);
              ::std::__cxx11::string::~string(local_be0);
            }
            stage_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_bc0);
          }
          nonstd::expected_lite::
          expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_718);
          ::std::__cxx11::string::~string
                    ((string *)
                     &targetPrimRet.contained.
                      super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          ::std::__cxx11::string::~string((string *)(targetPrimPropName.field_2._M_local_buf + 8));
          Path::~Path((Path *)((long)&targetPrimPath.field_2 + 8));
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_578);
          poVar2 = ::std::operator<<((ostream *)local_578,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"GetTerminalAttribute");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb30);
          ::std::operator<<(poVar2," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_5b8,"Multiple targetPaths assigned to .connection.",&local_5b9
                    );
          fmt::format(&local_598,&local_5b8);
          poVar2 = ::std::operator<<((ostream *)local_578,(string *)&local_598);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::~string((string *)&local_598);
          ::std::__cxx11::string::~string((string *)&local_5b8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=((string *)err,(string *)&target._valid);
            ::std::__cxx11::string::~string((string *)&target._valid);
          }
          stage_local._7_1_ = false;
          ::std::__cxx11::ostringstream::~ostringstream(local_578);
        }
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_218);
    }
    else {
      Attribute::operator=(value,attr);
      stage_local._7_1_ = true;
    }
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  }
  return stage_local._7_1_;
}

Assistant:

bool GetTerminalAttribute(const tinyusdz::Stage &stage,
                          const tinyusdz::Attribute &attr,
                          const std::string &attr_name, Attribute *value,
                          std::string *err) {
  if (!value) {
    PUSH_ERROR_AND_RETURN("`value` arg is nullptr.");
  }

  std::set<std::string> visited_paths;

  if (attr.is_connection()) {
    std::vector<Path> pv = attr.connections();
    if (pv.empty()) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Connection targetPath is empty for Attribute {}.", attr_name));
    }

    if (pv.size() > 1) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Multiple targetPaths assigned to .connection."));
    }

    auto target = pv[0];

    std::string targetPrimPath = target.prim_part();
    std::string targetPrimPropName = target.prop_part();
    DCOUT("connection targetPath : " << target << "(Prim: " << targetPrimPath
                                     << ", Prop: " << targetPrimPropName
                                     << ")");

    auto targetPrimRet =
        stage.GetPrimAtPath(Path(targetPrimPath, /* prop */ ""));
    if (targetPrimRet) {
      // Follow the connetion
      const Prim *targetPrim = targetPrimRet.value();

      std::string abs_path = target.full_path_name();

      if (visited_paths.count(abs_path)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Circular referencing detected. connectionTargetPath = {}",
            to_string(target)));
      }
      visited_paths.insert(abs_path);

      return GetTerminalAttributeImpl(stage, *targetPrim, targetPrimPropName,
                                      value, err, visited_paths);

    } else {
      PUSH_ERROR_AND_RETURN(targetPrimRet.error());
    }

  } else {
    (*value) = attr;
    return true;
  }

  return false;
}